

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O1

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  string *input;
  bool bVar3;
  PolicyStatus PVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  size_t sVar6;
  cmTarget *pcVar7;
  cmGlobalGenerator *this_00;
  size_type sVar8;
  long *plVar9;
  cmake *this_01;
  size_type *psVar10;
  PolicyID id;
  uint uVar11;
  _Alloc_hider _Var12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  string prop;
  string local_200;
  string *local_1e0;
  MessageType local_1d4;
  undefined8 local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  pcVar7 = this->Target;
  local_1e0 = lib;
  if (this->CurrentProcessingState == ProcessingKeywordLinkInterface ||
      pcVar7->TargetTypeValue != INTERFACE_LIBRARY) {
    uVar11 = this->CurrentProcessingState - ProcessingKeywordLinkInterface;
    cmMakefile::GetExecutionContext((cmListFileContext *)local_1a8,(this->super_cmCommand).Makefile)
    ;
    bVar3 = cmTarget::PushTLLCommandTrace(pcVar7,(uint)(4 < uVar11),(cmListFileContext *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_p != local_178) {
      operator_delete(local_188._M_p,local_178[0]._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023);
      if (PVar4 - NEW < 3) {
        pcVar14 = "must";
        local_1d4 = FATAL_ERROR;
        local_1d0 = CONCAT71((int7)(CONCAT44(extraout_var,PVar4) >> 8),1);
LAB_0031a4f5:
        bVar3 = false;
      }
      else {
        if (PVar4 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_200,(cmPolicies *)0x17,id);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                              local_200._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          pcVar14 = "should";
          local_1d0 = 0;
          local_1d4 = AUTHOR_WARNING;
          goto LAB_0031a4f5;
        }
        bVar3 = true;
        local_1d0 = 0;
        local_1d4 = AUTHOR_WARNING;
        pcVar14 = (char *)0x0;
      }
      if (!bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The ",4);
        pcVar13 = "keyword";
        if (4 >= uVar11) {
          pcVar13 = "plain";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar13,(ulong)(4 < uVar11) * 2 + 5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " signature for target_link_libraries has already been used with the target \"",
                   0x4c);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                            (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\".  All uses of target_link_libraries with a target ",0x34);
        sVar6 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar14,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," be either all-keyword or all-plain.\n",0x25);
        cmTarget::GetTllSignatureTraces(this->Target,(ostream *)local_1a8,(uint)(uVar11 < 5));
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,local_1d4,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((char)local_1d0 != '\0') {
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_0031a47e;
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
      pcVar7 = cmMakefile::FindLocalNonAliasTarget
                         ((this->super_cmCommand).Makefile,&this->Target->Name);
      if (pcVar7 == (cmTarget *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Attempt to add link library \"",0x1d);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(local_1e0->_M_dataplus)._M_p,
                            local_1e0->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" to target \"",0xd);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->Target->Name)._M_dataplus._M_p,
                            (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\" which is not built in this directory.",0x27);
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        pcVar7 = cmGlobalGenerator::FindTarget(this_00,local_1e0,false);
        if ((pcVar7 != (cmTarget *)0x0) &&
           (((INTERFACE_LIBRARY < pcVar7->TargetTypeValue ||
             ((0x86U >> (pcVar7->TargetTypeValue & 0x1f) & 1) == 0)) &&
            (bVar3 = cmTarget::IsExecutableWithExports(pcVar7), !bVar3)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(local_1e0->_M_dataplus)._M_p,
                              local_1e0->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" of type ",10);
          pcVar14 = cmState::GetTargetTypeName(pcVar7->TargetTypeValue);
          poVar5 = std::operator<<(poVar5,pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," may not be linked into another target.  ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"One may link only to STATIC or SHARED libraries, or ",0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"to executables with the ENABLE_EXPORTS property set.",0x34);
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        cmTarget::AddLinkLibrary(this->Target,(this->super_cmCommand).Makefile,local_1e0,llt);
      }
      input = local_1e0;
      if (this->CurrentProcessingState - ProcessingPlainPublicInterface < 2) {
        bVar3 = true;
        bVar15 = false;
      }
      else {
        if (this->CurrentProcessingState == ProcessingLinkLibraries) {
          pcVar7 = this->Target;
          local_1a8 = (undefined1  [8])&local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"INTERFACE_LINK_LIBRARIES","");
          cmTarget::GetDebugGeneratorExpressions(&local_200,this->Target,local_1e0,llt);
          cmTarget::AppendProperty(pcVar7,(string *)local_1a8,local_200._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,
                            CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]
                                    ) + 1);
          }
        }
        else if (this->Target->TargetTypeValue == STATIC_LIBRARY) {
          cmTarget::GetDebugGeneratorExpressions((string *)local_1a8,this->Target,local_1e0,llt);
          bVar3 = cmGeneratorExpression::IsValidTargetName(input);
          if ((bVar3) ||
             (sVar8 = cmGeneratorExpression::Find(local_1e0), sVar8 != 0xffffffffffffffff)) {
            std::operator+(&local_1c8,"$<LINK_ONLY:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
            psVar10 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_200.field_2._M_allocated_capacity = *psVar10;
              local_200.field_2._8_8_ = plVar9[3];
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            }
            else {
              local_200.field_2._M_allocated_capacity = *psVar10;
              local_200._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_200._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_200);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pcVar7 = this->Target;
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_200,"INTERFACE_LINK_LIBRARIES","");
          cmTarget::AppendProperty(pcVar7,&local_200,(char *)local_1a8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,
                            CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]
                                    ) + 1);
          }
        }
        bVar15 = true;
        bVar3 = false;
      }
      if (!bVar3) {
        return bVar15;
      }
    }
    pcVar7 = this->Target;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"INTERFACE_LINK_LIBRARIES","");
    cmTarget::GetDebugGeneratorExpressions(&local_200,this->Target,local_1e0,llt);
    cmTarget::AppendProperty(pcVar7,(string *)local_1a8,local_200._M_dataplus._M_p,false);
    paVar1 = &local_200.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    PVar4 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0022);
    bVar3 = true;
    if ((PVar4 < NEW) && (this->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
      this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1c8,this_01);
      local_1a0 = (char *)0x0;
      local_198._M_local_buf[0] = '\0';
      local_1a8 = (undefined1  [8])&local_198;
      if ((llt < OPTIMIZED_LibraryType) &&
         (local_1c8._M_dataplus._M_p != (pointer)local_1c8._M_string_length)) {
        _Var12._M_p = local_1c8._M_dataplus._M_p;
        do {
          std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x58d7cb);
          std::__cxx11::string::_M_append((char *)local_1a8,*(ulong *)_Var12._M_p);
          cmTarget::AppendProperty
                    (this->Target,(string *)local_1a8,(local_1e0->_M_dataplus)._M_p,false);
          _Var12._M_p = _Var12._M_p + 0x20;
        } while (_Var12._M_p != (pointer)local_1c8._M_string_length);
      }
      if ((llt & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
        pcVar7 = this->Target;
        local_200._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,"LINK_INTERFACE_LIBRARIES","");
        cmTarget::AppendProperty(pcVar7,&local_200,(local_1e0->_M_dataplus)._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != paVar1) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if (local_1c8._M_dataplus._M_p != (pointer)local_1c8._M_string_length) {
          _Var12._M_p = local_1c8._M_dataplus._M_p;
          do {
            std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x58d7cb);
            std::__cxx11::string::_M_append((char *)local_1a8,*(ulong *)_Var12._M_p);
            pcVar14 = cmTarget::GetProperty(this->Target,(string *)local_1a8);
            if (pcVar14 == (char *)0x0) {
              cmTarget::SetProperty(this->Target,(string *)local_1a8,"");
            }
            _Var12._M_p = _Var12._M_p + 0x20;
          } while (_Var12._M_p != (pointer)local_1c8._M_string_length);
        }
      }
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c8);
    }
  }
  else {
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
LAB_0031a47e:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                                 cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (this->CurrentProcessingState == ProcessingPlainPrivateInterface ||
     this->CurrentProcessingState == ProcessingPlainPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
     this->CurrentProcessingState == ProcessingKeywordPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext())) {
    std::ostringstream e;
    const char* modal = CM_NULLPTR;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig << " signature for target_link_libraries "
                                    "has already been used with the target \""
        << this->Target->GetName() << "\".  All uses of "
                                      "target_link_libraries with a target "
        << modal << " be either "
                    "all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case first.
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->CurrentProcessingState != ProcessingPlainLinkInterface) {

    cmTarget* t =
      this->Makefile->FindLocalNonAliasTarget(this->Target->GetName());
    if (!t) {
      std::ostringstream e;
      e << "Attempt to add link library \"" << lib << "\" to target \""
        << this->Target->GetName()
        << "\" which is not built in this directory.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    } else {

      cmTarget* tgt = this->Makefile->GetGlobalGenerator()->FindTarget(lib);

      if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
          (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
          (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
          !tgt->IsExecutableWithExports()) {
        std::ostringstream e;
        e << "Target \"" << lib << "\" of type "
          << cmState::GetTargetTypeName(tgt->GetType())
          << " may not be linked into another target.  "
          << "One may link only to STATIC or SHARED libraries, or "
          << "to executables with the ENABLE_EXPORTS property set.";
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      }

      this->Target->AddLinkLibrary(*this->Makefile, lib, llt);
    }

    if (this->CurrentProcessingState == ProcessingLinkLibraries) {
      this->Target->AppendProperty(
        "INTERFACE_LINK_LIBRARIES",
        this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());
      return true;
    }
    if (this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
        this->CurrentProcessingState != ProcessingPlainPublicInterface) {
      if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
        std::string configLib =
          this->Target->GetDebugGeneratorExpressions(lib, llt);
        if (cmGeneratorExpression::IsValidTargetName(lib) ||
            cmGeneratorExpression::Find(lib) != std::string::npos) {
          configLib = "$<LINK_ONLY:" + configLib + ">";
        }
        this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                     configLib.c_str());
      }
      // Not a 'public' or 'interface' library. Do not add to interface
      // property.
      return true;
    }
  }

  this->Target->AppendProperty(
    "INTERFACE_LINK_LIBRARIES",
    this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());

  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();

  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }

  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  std::string prop;

  // Include this library in the link interface for the target.
  if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
    // Put in the DEBUG configuration interfaces.
    for (std::vector<std::string>::const_iterator i = debugConfigs.begin();
         i != debugConfigs.end(); ++i) {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      this->Target->AppendProperty(prop, lib.c_str());
    }
  }
  if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
    // Put in the non-DEBUG configuration interfaces.
    this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", lib.c_str());

    // Make sure the DEBUG configuration interfaces exist so that the
    // general one will not be used as a fall-back.
    for (std::vector<std::string>::const_iterator i = debugConfigs.begin();
         i != debugConfigs.end(); ++i) {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      if (!this->Target->GetProperty(prop)) {
        this->Target->SetProperty(prop, "");
      }
    }
  }
  return true;
}